

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O2

exception_type_t parse_exception_type(char *value)

{
  exception_type_t eVar1;
  exception_type_t eVar2;
  
  if (*value == '1') {
    eVar2 = ET_ADDED;
  }
  else {
    if (*value != '2') {
      return ET_NOT_SET;
    }
    eVar2 = ET_REMOVED;
  }
  eVar1 = ET_NOT_SET;
  if (value[1] == '\0') {
    eVar1 = eVar2;
  }
  return eVar1;
}

Assistant:

exception_type_t parse_exception_type(const char *value) {
    if (strcmp(value, "1") == 0)
        return ET_ADDED;
    else if (strcmp(value, "2") == 0)
        return ET_REMOVED;
    else
        return ET_NOT_SET;
}